

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O2

void __thiscall CircBufTest::test7(CircBufTest *this)

{
  void *pvVar1;
  int iVar2;
  int len;
  CircularBuffer buf;
  int local_f4;
  CircularBuffer local_f0 [224];
  
  JetHead::CircularBuffer::CircularBuffer(local_f0,0x80);
  pvVar1 = operator_new__(0x80,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                          ,0x396);
  iVar2 = (int)pvVar1;
  JetHead::CircularBuffer::write((uchar *)local_f0,iVar2);
  JetHead::CircularBuffer::read((uchar *)local_f0,iVar2);
  JetHead::CircularBuffer::getBytes((int)local_f0,(int *)0x0);
  if (local_f4 != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0x3a0,"Empty circular buffer returning usable bytes");
  }
  JetHead::CircularBuffer::write((uchar *)local_f0,iVar2);
  JetHead::CircularBuffer::getBytes((int)local_f0,(int *)0x0);
  if (local_f4 != 0x80) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0x3a8,"Full circular buffer returning bogus byte count");
  }
  JetHead::CircularBuffer::~CircularBuffer(local_f0);
  return;
}

Assistant:

void CircBufTest::test7()
{
	CircularBuffer buf(BUFFER_SIZE);
	uint8_t* temp = jh_new uint8_t[BUFFER_SIZE];
	
	buf.write(temp, BUFFER_SIZE);
	buf.read(temp, BUFFER_SIZE);

	int len;
	const uint8_t* p = buf.getBytes(0, len);

	if (len != 0)
	{
		TestFailed("Empty circular buffer returning usable bytes");
	}
	
	buf.write(temp, BUFFER_SIZE);
	p = buf.getBytes(0, len);

	if (len != BUFFER_SIZE)
	{
		TestFailed("Full circular buffer returning bogus byte count");
	}
}